

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O2

int __thiscall QTextCursor::columnNumber(QTextCursor *this)

{
  QTextCursorPrivate *pQVar1;
  bool bVar2;
  int iVar3;
  QTextLayout *this_00;
  int iVar4;
  long in_FS_OFFSET;
  QTextLine QVar5;
  undefined1 *local_48;
  QTextEngine *local_40;
  undefined1 local_38 [16];
  qreal local_28;
  
  local_28 = *(qreal *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d).d.ptr;
  iVar4 = 0;
  if ((pQVar1 != (QTextCursorPrivate *)0x0) &&
     (iVar4 = 0, pQVar1->priv != (QTextDocumentPrivate *)0x0)) {
    local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTextCursorPrivate::block((QTextCursorPrivate *)local_38);
    bVar2 = QTextBlock::isValid((QTextBlock *)local_38);
    iVar4 = 0;
    if (bVar2) {
      this_00 = QTextCursorPrivate::blockLayout((this->d).d.ptr,(QTextBlock *)local_38);
      iVar4 = ((this->d).d.ptr)->position;
      iVar3 = QTextBlock::position((QTextBlock *)local_38);
      iVar4 = iVar4 - iVar3;
      iVar3 = QTextLayout::lineCount(this_00);
      if (iVar3 != 0) {
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        QVar5 = QTextLayout::lineForTextPosition(this_00,iVar4);
        local_40 = QVar5.eng;
        local_48 = (undefined1 *)CONCAT44(local_48._4_4_,QVar5.index);
        if (local_40 == (QTextEngine *)0x0) {
          iVar4 = 0;
        }
        else {
          iVar3 = QTextLine::textStart((QTextLine *)&local_48);
          iVar4 = iVar4 - iVar3;
        }
      }
    }
  }
  if (*(qreal *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

int QTextCursor::columnNumber() const
{
    if (!d || !d->priv)
        return 0;

    QTextBlock block = d->block();
    if (!block.isValid())
        return 0;

    const QTextLayout *layout = d->blockLayout(block);

    const int relativePos = d->position - block.position();

    if (layout->lineCount() == 0)
        return relativePos;

    QTextLine line = layout->lineForTextPosition(relativePos);
    if (!line.isValid())
        return 0;
    return relativePos - line.textStart();
}